

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRefining.cpp
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::anon_unknown_173::TypeRefining::updateTypes::WriteUpdater::create(WriteUpdater *this)

{
  unique_ptr<WriteUpdater,_std::default_delete<WriteUpdater>_> local_20 [2];
  WriteUpdater *this_local;
  
  this_local = this;
  std::
  make_unique<wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::WriteUpdater>()
  ;
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::WriteUpdater,std::default_delete<wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::WriteUpdater>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,local_20);
  std::unique_ptr<WriteUpdater,_std::default_delete<WriteUpdater>_>::~unique_ptr(local_20);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
        return std::make_unique<WriteUpdater>();
      }